

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O3

SamplingStatus * __thiscall
jaegertracing::samplers::RemotelyControlledSampler::isSampled
          (SamplingStatus *__return_storage_ptr__,RemotelyControlledSampler *this,TraceID *id,
          string *operation)

{
  element_type *peVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  peVar1 = (this->_sampler).
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Sampler[2])(__return_storage_ptr__,peVar1,id,operation);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return __return_storage_ptr__;
  }
  __assert_fail("_sampler",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/RemotelyControlledSampler.cpp"
                ,0x73,
                "virtual SamplingStatus jaegertracing::samplers::RemotelyControlledSampler::isSampled(const TraceID &, const std::string &)"
               );
}

Assistant:

SamplingStatus
RemotelyControlledSampler::isSampled(const TraceID& id,
                                     const std::string& operation)
{
    std::lock_guard<std::mutex> lock(_mutex);
    assert(_sampler);
    return _sampler->isSampled(id, operation);
}